

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::PropagateSimpleDatePartStatistics<0l,60000l>
          (vector<duckdb::BaseStatistics,_true> *child_stats)

{
  reference stats;
  BaseStatistics *in_RDI;
  BaseStatistics result;
  size_type in_stack_fffffffffffffec8;
  vector<duckdb::BaseStatistics,_true> *in_stack_fffffffffffffed0;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> stats_00;
  LogicalType *in_stack_fffffffffffffef0;
  int64_t in_stack_ffffffffffffff08;
  BaseStatistics *in_stack_ffffffffffffff18;
  undefined1 local_80 [24];
  LogicalType *in_stack_ffffffffffffff98;
  
  stats_00._M_head_impl = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffef0,(LogicalTypeId)((ulong)local_80 >> 0x38));
  NumericStats::CreateEmpty(in_stack_ffffffffffffff98);
  LogicalType::~LogicalType((LogicalType *)0x1eeafdc);
  stats = vector<duckdb::BaseStatistics,_true>::operator[]
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  BaseStatistics::CopyValidity((BaseStatistics *)&stack0xffffffffffffff98,stats);
  Value::BIGINT(in_stack_ffffffffffffff08);
  NumericStats::SetMin(stats_00._M_head_impl,(Value *)in_RDI);
  Value::~Value((Value *)stats);
  Value::BIGINT(in_stack_ffffffffffffff08);
  NumericStats::SetMax(stats_00._M_head_impl,(Value *)in_RDI);
  Value::~Value((Value *)stats);
  BaseStatistics::ToUnique(in_stack_ffffffffffffff18);
  BaseStatistics::~BaseStatistics(stats);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         stats_00._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateSimpleDatePartStatistics(vector<BaseStatistics> &child_stats) {
	// we can always propagate simple date part statistics
	// since the min and max can never exceed these bounds
	auto result = NumericStats::CreateEmpty(LogicalType::BIGINT);
	result.CopyValidity(child_stats[0]);
	NumericStats::SetMin(result, Value::BIGINT(MIN));
	NumericStats::SetMax(result, Value::BIGINT(MAX));
	return result.ToUnique();
}